

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.h
# Opt level: O1

void __thiscall Liby::Poller::~Poller(Poller *this)

{
  pointer ppCVar1;
  
  this->_vptr_Poller = (_func_int **)&PTR__Poller_0012d410;
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->afterLoopHandlers_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->nextLoopHandlers_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->nextTickHandlers_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  ppCVar1 = (this->channels_).super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Poller() {}